

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

bool __thiscall
MakefileGenerator::processPrlFile(MakefileGenerator *this,QString *file,bool baseOnly)

{
  longlong lVar1;
  QChar c;
  QChar c_00;
  QChar c_01;
  byte bVar2;
  ulong uVar3;
  longlong *plVar4;
  qsizetype qVar5;
  byte in_DL;
  QStringView *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar6;
  QStringView QVar7;
  int ext;
  int off;
  QString f;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_000003fc;
  QStringView in_stack_00000490;
  undefined4 in_stack_fffffffffffffe98;
  CaseSensitivity in_stack_fffffffffffffe9c;
  QStringView *in_stack_fffffffffffffea0;
  undefined6 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  QStringView *in_stack_fffffffffffffeb0;
  QStringView *this_00;
  undefined7 in_stack_fffffffffffffec0;
  qsizetype in_stack_fffffffffffffec8;
  qsizetype local_120;
  storage_type_conflict *local_118;
  qsizetype local_110;
  storage_type_conflict *local_108;
  bool local_d9;
  undefined1 in_stack_ffffffffffffff47;
  QString *in_stack_ffffffffffffff48;
  MakefileGenerator *in_stack_ffffffffffffff50;
  QChar local_8a;
  qsizetype local_88;
  QChar local_7a;
  qsizetype local_78;
  QStringBuilder<QString_&,_QString_&> local_70;
  QString *in_stack_ffffffffffffffc0;
  QString *in_stack_ffffffffffffffc8;
  MakefileGenerator *in_stack_ffffffffffffffd0;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QFlags<MakefileGenerator::FileFixifyType>::QFlags
            ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe9c);
  fileFixify(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (FileFixifyTypes)in_stack_000003fc.i,(bool)in_stack_ffffffffffffff47);
  if (((in_DL & 1) == 0) &&
     (uVar3 = QString::endsWith((QString *)&local_20,0x3bda88), (uVar3 & 1) != 0)) {
    QStringView::QStringView((QStringView *)&stack0xffffffffffffffc8);
    local_d9 = processPrlFileCore(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                                  in_stack_00000490,in_stack_ffffffffffffffc0);
  }
  else {
    this_00 = in_RSI;
    QStringView::QStringView((QStringView *)&stack0xffffffffffffffb8);
    local_70 = ::operator+((QString *)in_stack_fffffffffffffea0,
                           (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
    ;
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString_&,_QString_&> *)
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    bVar2 = processPrlFileCore(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_00000490
                               ,in_stack_ffffffffffffffc0);
    QString::~QString((QString *)0x181c0d);
    if ((bVar2 & 1) == 0) {
      if ((in_DL & 1) == 0) {
        QChar::QChar<char,_true>(&local_7a,'/');
        c.ucs._1_1_ = in_stack_fffffffffffffeaf;
        c.ucs._0_1_ = in_stack_fffffffffffffeae;
        local_78 = QString::lastIndexOf
                             ((QString *)in_stack_fffffffffffffea0,c,in_stack_fffffffffffffe9c);
        QChar::QChar<char,_true>(&local_8a,'\\');
        c_00.ucs._1_1_ = in_stack_fffffffffffffeaf;
        c_00.ucs._0_1_ = in_stack_fffffffffffffeae;
        local_88 = QString::lastIndexOf
                             ((QString *)in_stack_fffffffffffffea0,c_00,in_stack_fffffffffffffe9c);
        plVar4 = qMax<long_long>(&local_78,&local_88);
        lVar1 = *plVar4;
        QStringView::QStringView<QString,_true>
                  (in_stack_fffffffffffffeb0,
                   (QString *)
                   CONCAT17(in_stack_fffffffffffffeaf,
                            CONCAT16(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8)));
        QStringView::mid(this_00,in_stack_fffffffffffffec8,CONCAT17(bVar2,in_stack_fffffffffffffec0)
                        );
        QChar::QChar<char,_true>((QChar *)&stack0xffffffffffffff4e,'.');
        c_01.ucs._1_1_ = in_stack_fffffffffffffeaf;
        c_01.ucs._0_1_ = in_stack_fffffffffffffeae;
        qVar5 = QStringView::lastIndexOf(in_stack_fffffffffffffea0,c_01,in_stack_fffffffffffffe9c);
        if ((int)qVar5 != -1) {
          QStringView::QStringView<QString,_true>
                    (in_RSI,(QString *)
                            CONCAT17(in_stack_fffffffffffffeaf,
                                     CONCAT16(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8)))
          ;
          QVar6 = QStringView::mid(this_00,in_stack_fffffffffffffec8,
                                   CONCAT17(bVar2,in_stack_fffffffffffffec0));
          QStringView::QStringView<QString,_true>
                    (in_RSI,(QString *)
                            CONCAT17(in_stack_fffffffffffffeaf,
                                     CONCAT16(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8)))
          ;
          QVar7 = QStringView::left(this_00,(qsizetype)in_RSI);
          local_110 = QVar6.m_size;
          local_108 = QVar6.m_data;
          local_120 = QVar7.m_size;
          local_118 = QVar7.m_data;
          bVar2 = (**(code **)(*in_RDI + 200))
                            (in_RDI,in_RSI,local_110,local_108,local_120,local_118,(int)lVar1 + 1);
          local_d9 = (bool)(bVar2 & 1);
          goto LAB_00181e06;
        }
      }
      local_d9 = false;
    }
    else {
      local_d9 = true;
    }
  }
LAB_00181e06:
  QString::~QString((QString *)0x181e13);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_d9;
}

Assistant:

bool
MakefileGenerator::processPrlFile(QString &file, bool baseOnly)
{
    QString f = fileFixify(file, FileFixifyBackwards);
    // Explicitly given full .prl name
    if (!baseOnly && f.endsWith(Option::prl_ext))
        return processPrlFileCore(file, QStringView(), f);
    // Explicitly given or derived (from -l) base name
    if (processPrlFileCore(file, QStringView(), f + Option::prl_ext))
        return true;
    if (!baseOnly) {
        // Explicitly given full library name
        int off = qMax(f.lastIndexOf('/'), f.lastIndexOf('\\')) + 1;
        int ext = QStringView(f).mid(off).lastIndexOf('.');
        if (ext != -1)
            return processPrlFileBase(file, QStringView(f).mid(off), QStringView{f}.left(off + ext), off);
    }
    return false;
}